

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O0

Variable * __thiscall
rsg::VariableScope::allocate(VariableScope *this,VariableType *type,Storage storage,char *name)

{
  Variable *this_00;
  exception *anon_var_0;
  Variable *local_30;
  Variable *variable;
  char *name_local;
  VariableType *pVStack_18;
  Storage storage_local;
  VariableType *type_local;
  VariableScope *this_local;
  
  variable = (Variable *)name;
  name_local._4_4_ = storage;
  pVStack_18 = type;
  type_local = (VariableType *)this;
  this_00 = (Variable *)operator_new(0x80);
  rsg::Variable::Variable(this_00,pVStack_18,name_local._4_4_,(char *)variable);
  local_30 = this_00;
  std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::push_back
            (&this->m_liveVariables,&local_30);
  return local_30;
}

Assistant:

Variable* VariableScope::allocate (const VariableType& type, Variable::Storage storage, const char* name)
{
	Variable* variable = new Variable(type, storage, name);
	try
	{
		m_liveVariables.push_back(variable);
		return variable;
	}
	catch (const std::exception&)
	{
		delete variable;
		throw;
	}
}